

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matte.cpp
# Opt level: O1

RGBColor __thiscall pm::Matte::areaLightShade(Matte *this,ShadeRecord *sr)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  ulong uVar4;
  long in_RDX;
  long lVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  RGBColor RVar13;
  Ray shadowRay;
  Vector3 wi;
  float local_6c;
  float local_68;
  float local_64;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  Matte *local_38;
  
  fVar12 = (sr->normal).z;
  fVar8 = (sr->ray).o.x;
  fVar11 = (sr->ray).o.y;
  fVar7 = (sr->ray).o.z;
  (**(code **)(**(long **)(*(long *)(in_RDX + 0x60) + 0x70) + 0x18))(&local_5c);
  fVar11 = fVar11 * fVar12 * local_58;
  *(float *)&(this->super_Material)._vptr_Material = fVar8 * fVar12 * local_5c;
  *(float *)((long)&(this->super_Material)._vptr_Material + 4) = fVar11;
  (this->super_Material).type_ = (Type)(fVar12 * fVar7 * local_54);
  local_64 = *(float *)&(this->super_Material)._vptr_Material;
  local_68 = *(float *)((long)&(this->super_Material)._vptr_Material + 4);
  local_6c = (float)(this->super_Material).type_;
  lVar5 = *(long *)(*(long *)(in_RDX + 0x60) + 0x80) - *(long *)(*(long *)(in_RDX + 0x60) + 0x78);
  local_38 = this;
  if (lVar5 != 0) {
    uVar4 = 0;
    uVar6 = 1;
    do {
      plVar1 = *(long **)(*(long *)(*(long *)(in_RDX + 0x60) + 0x78) + uVar4 * 8);
      (**(code **)(*plVar1 + 0x10))(&local_44,plVar1);
      fVar12 = *(float *)(in_RDX + 0x30) * local_3c +
               *(float *)(in_RDX + 0x28) * local_44 + *(float *)(in_RDX + 0x2c) * local_40;
      fVar11 = local_40;
      if (0.0 < fVar12) {
        if (*(char *)((long)plVar1 + 0xc) == '\x01') {
          local_5c = *(float *)(in_RDX + 0x10);
          local_58 = *(float *)(in_RDX + 0x14);
          local_54 = *(float *)(in_RDX + 0x18);
          local_50 = local_44;
          local_4c = local_40;
          local_48 = local_3c;
          cVar3 = (**(code **)(*plVar1 + 0x20))(plVar1,&local_5c);
          if (cVar3 != '\0') goto LAB_0010ea2e;
        }
        fVar8 = *(float *)&sr->world;
        fVar11 = *(float *)((long)&sr->world + 4);
        fVar7 = *(float *)&sr->tracer;
        fVar9 = *(float *)((long)&sr->tracer + 4);
        (**(code **)(*plVar1 + 0x18))(&local_5c,plVar1);
        fVar11 = fVar11 * fVar8 * 0.31830987 * local_5c;
        fVar7 = fVar7 * fVar8 * 0.31830987 * local_58;
        fVar8 = fVar8 * fVar9 * 0.31830987 * local_54;
        fVar9 = (float)(**(code **)(*plVar1 + 0x28))(plVar1);
        fVar10 = (float)(**(code **)(*plVar1 + 0x30))(plVar1);
        fVar11 = (fVar11 * fVar9 * fVar12) / fVar10;
        local_64 = local_64 + fVar11;
        local_68 = local_68 + (fVar7 * fVar9 * fVar12) / fVar10;
        local_6c = local_6c + (fVar8 * fVar9 * fVar12) / fVar10;
      }
LAB_0010ea2e:
      bVar2 = uVar6 < (ulong)(lVar5 >> 3);
      uVar4 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  *(float *)&(local_38->super_Material)._vptr_Material = local_64;
  *(float *)((long)&(local_38->super_Material)._vptr_Material + 4) = local_68;
  RVar13.g = 0.0;
  RVar13.r = local_6c;
  (local_38->super_Material).type_ = (Type)local_6c;
  RVar13.b = fVar11;
  return RVar13;
}

Assistant:

RGBColor Matte::areaLightShade(ShadeRecord &sr) const
{
	const Vector3 wo = -sr.ray.d;
	RGBColor L = ambientBrdf_.rho(sr, wo) * sr.world.ambientLight().L(sr);
	const size_t numLights = sr.world.lights().size();

	for (unsigned int i = 0; i < numLights; i++)
	{
		const Light &light = *sr.world.lights()[i];
		const Vector3 wi = light.direction(sr);
		const float nDotWi = dot(sr.normal, wi);

		if (nDotWi > 0.0f)
		{
			bool inShadow = false;

			if (light.castShadows())
			{
				Ray shadowRay(sr.hitPoint, wi);
				inShadow = light.inShadow(shadowRay, sr);
			}

			if (inShadow == false)
				L += diffuseBrdf_.f(sr, wo, wi) * light.L(sr) * light.G(sr) * nDotWi / light.pdf(sr);
		}
	}

	return L;
}